

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool setFontStyleFromValue(Value *value,QFont *font)

{
  int iVar1;
  bool bVar2;
  Style style;
  
  bVar2 = false;
  style = StyleNormal;
  if (value->type == KnownIdentifier) {
    iVar1 = QVariant::toInt((bool *)&value->variant);
    if (iVar1 != 1) {
      if (iVar1 == 0xc) {
        style = StyleOblique;
      }
      else {
        if (iVar1 != 0xb) {
          return false;
        }
        style = StyleItalic;
      }
    }
    QFont::setStyle(font,style);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool setFontStyleFromValue(const QCss::Value &value, QFont *font)
{
    if (value.type != Value::KnownIdentifier)
        return false ;
    switch (value.variant.toInt()) {
        case Value_Normal: font->setStyle(QFont::StyleNormal); return true;
        case Value_Italic: font->setStyle(QFont::StyleItalic); return true;
        case Value_Oblique: font->setStyle(QFont::StyleOblique); return true;
        default: break;
    }
    return false;
}